

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O3

FTextureID __thiscall FTextureManager::AddTexture(FTextureManager *this,FTexture *texture)

{
  uint *puVar1;
  char *s;
  TextureHash *pTVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  if (texture == (FTexture *)0x0) {
    uVar5 = 0xffffffff;
  }
  else {
    s = (texture->Name).Chars;
    if (*s == '\0') {
      uVar3 = 0xffffffff;
      iVar4 = -1;
    }
    else {
      uVar3 = MakeKey(s);
      uVar3 = uVar3 % 0x403;
      iVar4 = this->HashFirst[uVar3];
    }
    TArray<FTextureManager::TextureHash,_FTextureManager::TextureHash>::Grow(&this->Textures,1);
    pTVar2 = (this->Textures).Array;
    uVar5 = (this->Textures).Count;
    pTVar2[uVar5].Texture = texture;
    pTVar2[uVar5].HashNext = iVar4;
    uVar5 = (this->Textures).Count;
    (this->Textures).Count = uVar5 + 1;
    TArray<int,_int>::Grow(&this->Translation,1);
    (this->Translation).Array[(this->Translation).Count] = uVar5;
    puVar1 = &(this->Translation).Count;
    *puVar1 = *puVar1 + 1;
    if (-1 < (int)uVar3) {
      this->HashFirst[uVar3] = uVar5;
    }
    (texture->id).texnum = uVar5;
  }
  return (FTextureID)uVar5;
}

Assistant:

FTextureID FTextureManager::AddTexture (FTexture *texture)
{
	int bucket;
	int hash;

	if (texture == NULL) return FTextureID(-1);

	// Later textures take precedence over earlier ones

	// Textures without name can't be looked for
	if (texture->Name[0] != '\0')
	{
		bucket = int(MakeKey (texture->Name) % HASH_SIZE);
		hash = HashFirst[bucket];
	}
	else
	{
		bucket = -1;
		hash = -1;
	}

	TextureHash hasher = { texture, hash };
	int trans = Textures.Push (hasher);
	Translation.Push (trans);
	if (bucket >= 0) HashFirst[bucket] = trans;
	return (texture->id = FTextureID(trans));
}